

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::RenderPassCreateInfo::addDependency
          (RenderPassCreateInfo *this,VkSubpassDependency dependency)

{
  pointer *ppSVar1;
  iterator __position;
  pointer pVVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined8 uVar5;
  allocator_type local_31;
  SubpassDependency local_30;
  
  local_30.super_VkSubpassDependency.srcSubpass = dependency.srcSubpass;
  local_30.super_VkSubpassDependency.dstSubpass = dependency.dstSubpass;
  local_30.super_VkSubpassDependency.srcStageMask = dependency.srcStageMask;
  local_30.super_VkSubpassDependency.dstStageMask = dependency.dstStageMask;
  local_30.super_VkSubpassDependency.srcAccessMask = dependency.srcAccessMask;
  local_30.super_VkSubpassDependency.dstAccessMask = dependency.dstAccessMask;
  local_30.super_VkSubpassDependency.dependencyFlags = dependency.dependencyFlags;
  __position._M_current =
       (this->m_dependiences).
       super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_dependiences).
      super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
    _M_realloc_insert<vkt::Draw::SubpassDependency>(&this->m_dependiences,__position,&local_30);
  }
  else {
    uVar3 = dependency._0_8_;
    uVar5 = dependency._8_8_;
    ((__position._M_current)->super_VkSubpassDependency).dstStageMask = dependency.dstStageMask;
    ((__position._M_current)->super_VkSubpassDependency).srcAccessMask = dependency.srcAccessMask;
    ((__position._M_current)->super_VkSubpassDependency).dstAccessMask = dependency.dstAccessMask;
    ((__position._M_current)->super_VkSubpassDependency).dependencyFlags =
         dependency.dependencyFlags;
    ((__position._M_current)->super_VkSubpassDependency).srcSubpass = (int)uVar3;
    ((__position._M_current)->super_VkSubpassDependency).dstSubpass = (int)((ulong)uVar3 >> 0x20);
    ((__position._M_current)->super_VkSubpassDependency).srcStageMask = (int)uVar5;
    ((__position._M_current)->super_VkSubpassDependency).dstStageMask = (int)((ulong)uVar5 >> 0x20);
    ppSVar1 = &(this->m_dependiences).
               super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_30,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_31);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::_M_move_assign
            (&this->m_dependiencesStructs,
             (vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_30);
  pvVar4 = (void *)CONCAT44(local_30.super_VkSubpassDependency.dstSubpass,
                            local_30.super_VkSubpassDependency.srcSubpass);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_30.super_VkSubpassDependency.dstAccessMask,
                                    local_30.super_VkSubpassDependency.srcAccessMask) - (long)pvVar4
                   );
  }
  pVVar2 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).dependencyCount =
       (int)((ulong)((long)(this->m_dependiences).
                           super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_dependiences).
                          super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
  (this->super_VkRenderPassCreateInfo).pDependencies = pVVar2;
  return;
}

Assistant:

void
RenderPassCreateInfo::addDependency (vk::VkSubpassDependency dependency)
{

	m_dependiences.push_back(dependency);
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>(m_dependiences.begin(), m_dependiences.end());

	dependencyCount			= static_cast<deUint32>(m_dependiences.size());
	pDependencies			= &m_dependiencesStructs[0];
}